

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_recv(nghttp2_session *session)

{
  bool bVar1;
  ulong uVar2;
  ulong unaff_RBP;
  ulong inlen;
  uint8_t buf [16384];
  uint8_t auStack_4028 [16392];
  
  do {
    uVar2 = (*(session->callbacks).recv_callback)(session,auStack_4028,0x4000,0,session->user_data);
    if ((long)uVar2 < 1) {
      if (((uVar2 == 0xfffffffffffffe05) || (uVar2 == 0)) ||
         (inlen = 0xfffffffffffffc7a, uVar2 == 0xfffffffffffffe08)) goto LAB_00633928;
    }
    else {
      inlen = 0xfffffffffffffc7a;
      if (uVar2 < 0x4001) {
LAB_00633928:
        inlen = uVar2;
      }
    }
    if ((long)inlen < 1) {
      unaff_RBP = 0;
      if (inlen != 0) {
        bVar1 = false;
        if (inlen == 0xfffffffffffffe08) goto LAB_0063397d;
        if (inlen == 0xfffffffffffffe05) {
          unaff_RBP = 0xfffffe05;
        }
        else {
          unaff_RBP = 0xfffffc7a;
        }
      }
      bVar1 = false;
    }
    else {
      uVar2 = nghttp2_session_mem_recv(session,auStack_4028,inlen);
      bVar1 = (long)uVar2 >= 0;
      if ((long)uVar2 < 0) {
        unaff_RBP = uVar2 & 0xffffffff;
      }
      else if (uVar2 != inlen) {
        __assert_fail("proclen == readlen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1cc7,"int nghttp2_session_recv(nghttp2_session *)");
      }
    }
LAB_0063397d:
    if (!bVar1) {
      return (int)unaff_RBP;
    }
  } while( true );
}

Assistant:

int nghttp2_session_recv(nghttp2_session *session) {
  uint8_t buf[NGHTTP2_INBOUND_BUFFER_LENGTH];
  while (1) {
    ssize_t readlen;
    readlen = session_recv(session, buf, sizeof(buf));
    if (readlen > 0) {
      ssize_t proclen = nghttp2_session_mem_recv(session, buf, (size_t)readlen);
      if (proclen < 0) {
        return (int)proclen;
      }
      assert(proclen == readlen);
    } else if (readlen == 0 || readlen == NGHTTP2_ERR_WOULDBLOCK) {
      return 0;
    } else if (readlen == NGHTTP2_ERR_EOF) {
      return NGHTTP2_ERR_EOF;
    } else if (readlen < 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }
}